

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arduino-rx-web.cpp
# Opt level: O0

bool GGWave_mainLoop(void)

{
  ggvector *pgVar1;
  FILE *__stream;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  uchar *puVar8;
  tm *__tp;
  char *pcVar9;
  undefined1 *puVar10;
  undefined8 uVar11;
  float fVar12;
  uint32_t nBytes;
  string tstr;
  time_t timestamp;
  int n;
  TxRxData rxData;
  int nNeed;
  int nHave;
  time_point tNow;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff28;
  allocator_type *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff40;
  allocator local_71;
  string local_70 [32];
  time_t local_50;
  int local_44;
  ggvector<unsigned_char> local_40 [2];
  int local_18;
  int local_14;
  duration local_10;
  bool local_1;
  
  if (((anonymous_namespace)::g_devIdInp == 0) && ((anonymous_namespace)::g_devIdOut == 0)) {
    local_1 = false;
  }
  else {
    bVar2 = GGWave::txHasData();
    if ((bVar2 & 1) == 0) {
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,0);
      if ((GGWave_mainLoop()::tLastNoData == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GGWave_mainLoop()::tLastNoData), iVar3 != 0)) {
        GGWave_mainLoop::tLastNoData.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        __cxa_guard_release(&GGWave_mainLoop()::tLastNoData);
      }
      local_10.__r = std::chrono::_V2::system_clock::now();
      iVar3 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdOut);
      iVar4 = GGWave::samplesPerFrame();
      iVar5 = GGWave::sampleSizeOut();
      if (iVar3 < iVar4 * iVar5) {
        SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,0);
        local_14 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdInp);
        iVar3 = GGWave::samplesPerFrame();
        local_18 = GGWave::sampleSizeInp();
        local_18 = iVar3 * local_18;
        fVar12 = getTime_ms<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        if ((fVar12 <= 500.0) || (local_14 < local_18)) {
          SDL_ClearQueuedAudio((anonymous_namespace)::g_devIdInp);
        }
        else {
          if ((GGWave_mainLoop()::dataInp == '\0') &&
             (iVar3 = __cxa_guard_acquire(&GGWave_mainLoop()::dataInp), iVar3 != 0)) {
            std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x108209);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30
                      );
            std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x10822e);
            __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                         &GGWave_mainLoop::dataInp,&__dso_handle);
            __cxa_guard_release(&GGWave_mainLoop()::dataInp);
          }
          iVar3 = (anonymous_namespace)::g_devIdInp;
          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10826a);
          SDL_DequeueAudio(iVar3,puVar8,local_18);
          pgVar1 = (anonymous_namespace)::g_ggWave;
          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x108295);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&GGWave_mainLoop::dataInp);
          bVar2 = GGWave::decode(pgVar1,(uint)puVar8);
          if ((bVar2 & 1) == 0) {
            fprintf(_stderr,"Warning: failed to decode input data!\n");
          }
          else {
            ggvector<unsigned_char>::ggvector(local_40);
            local_44 = GGWave::rxTakeData((anonymous_namespace)::g_ggWave);
            if (0 < local_44) {
              local_50 = time((time_t *)0x0);
              __tp = localtime(&local_50);
              pcVar9 = asctime(__tp);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_70,pcVar9,&local_71);
              std::allocator<char>::~allocator((allocator<char> *)&local_71);
              puVar10 = (undefined1 *)std::__cxx11::string::back();
              *puVar10 = 0;
              uVar11 = std::__cxx11::string::c_str();
              puVar8 = ggvector<unsigned_char>::data(local_40);
              printf("[%s] Received: \'%s\'\n",uVar11,puVar8);
              std::__cxx11::string::~string(local_70);
            }
          }
          __stream = _stderr;
          if (local_18 * 0x20 < local_14) {
            uVar6 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdInp);
            fprintf(__stream,
                    "Warning: slow processing, clearing queued audio buffer of %d bytes ...",
                    (ulong)uVar6);
            SDL_ClearQueuedAudio((anonymous_namespace)::g_devIdInp);
          }
        }
      }
      else {
        GGWave_mainLoop::tLastNoData.__d.__r = (duration)(duration)local_10.__r;
      }
    }
    else {
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,1);
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,1);
      uVar7 = GGWave::encode();
      iVar3 = (anonymous_namespace)::g_devIdOut;
      uVar11 = GGWave::txWaveform();
      SDL_QueueAudio(iVar3,uVar11,uVar7);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool GGWave_mainLoop() {
    if (g_devIdInp == 0 && g_devIdOut == 0) {
        return false;
    }

    if (g_ggWave->txHasData() == false) {
        SDL_PauseAudioDevice(g_devIdOut, SDL_FALSE);

        static auto tLastNoData = std::chrono::high_resolution_clock::now();
        auto tNow = std::chrono::high_resolution_clock::now();

        if ((int) SDL_GetQueuedAudioSize(g_devIdOut) < g_ggWave->samplesPerFrame()*g_ggWave->sampleSizeOut()) {
            SDL_PauseAudioDevice(g_devIdInp, SDL_FALSE);
            const int nHave = (int) SDL_GetQueuedAudioSize(g_devIdInp);
            const int nNeed = g_ggWave->samplesPerFrame()*g_ggWave->sampleSizeInp();
            if (::getTime_ms(tLastNoData, tNow) > 500.0f && nHave >= nNeed) {
                static std::vector<uint8_t> dataInp(nNeed);
                SDL_DequeueAudio(g_devIdInp, dataInp.data(), nNeed);

                if (g_ggWave->decode(dataInp.data(), dataInp.size()) == false) {
                    fprintf(stderr, "Warning: failed to decode input data!\n");
                } else {
                    GGWave::TxRxData rxData;
                    int n = g_ggWave->rxTakeData(rxData);
                    if (n > 0) {
                        std::time_t timestamp = std::time(nullptr);
                        std::string tstr = std::asctime(std::localtime(&timestamp));
                        tstr.back() = 0;
                        printf("[%s] Received: '%s'\n", tstr.c_str(), rxData.data());
                    }
                }

                if (nHave > 32*nNeed) {
                    fprintf(stderr, "Warning: slow processing, clearing queued audio buffer of %d bytes ...", SDL_GetQueuedAudioSize(g_devIdInp));
                    SDL_ClearQueuedAudio(g_devIdInp);
                }
            } else {
                SDL_ClearQueuedAudio(g_devIdInp);
            }
        } else {
            tLastNoData = tNow;
        }
    } else {
        SDL_PauseAudioDevice(g_devIdOut, SDL_TRUE);
        SDL_PauseAudioDevice(g_devIdInp, SDL_TRUE);

        const auto nBytes = g_ggWave->encode();
        SDL_QueueAudio(g_devIdOut, g_ggWave->txWaveform(), nBytes);
    }

    return true;
}